

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O3

void anon_unknown.dwarf_34a0d1::writeReadYa
               (Box2i *dw,int tileSizeX,int tileSizeY,char *fileName,
               _func_void_Array2D<Imf_3_4::Rgba>_ptr_int_int *fillPixels)

{
  ulong uVar1;
  float *pfVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  undefined8 uVar8;
  half *phVar9;
  undefined4 in_register_00000014;
  long lVar10;
  undefined4 in_register_00000034;
  char *__filename;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  Array2D<Imf_3_4::Rgba> pixels1;
  TiledRgbaOutputFile out;
  undefined8 local_38;
  
  __filename = (char *)CONCAT44(in_register_00000034,tileSizeX);
  lVar10 = (long)(dw->max).x - (long)(dw->min).x;
  uVar1 = lVar10 + 1;
  iVar4 = (dw->max).y - (dw->min).y;
  uVar13 = iVar4 + 1;
  pixels1._sizeX = (long)(int)uVar13;
  uVar14 = -(ulong)(pixels1._sizeX * uVar1 >> 0x3d != 0) | pixels1._sizeX * uVar1 * 8;
  pixels1._sizeY = uVar1;
  pixels1._data = (Rgba *)operator_new__(uVar14);
  pvVar7 = operator_new__(uVar14);
  (*(code *)CONCAT44(in_register_00000014,tileSizeY))(&pixels1,uVar1 & 0xffffffff,uVar13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
  std::ostream::flush();
  local_38 = 0;
  uVar8 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,__filename,0x13,0x1b,0,0,dw,dw,0x18,
             &local_38,0,3,uVar8);
  Imf_3_4::TiledRgbaOutputFile::setFrameBuffer
            ((Rgba *)&out,
             (ulong)(pixels1._data + (-(long)(dw->min).y * pixels1._sizeY - (long)(dw->min).x)),1);
  iVar5 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)&out);
  iVar6 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)&out);
  Imf_3_4::TiledRgbaOutputFile::writeTiles((int)&out,0,iVar5 + -1,0,iVar6 + -1);
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  std::ostream::flush();
  iVar5 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,__filename,iVar5);
  Imf_3_4::TiledRgbaInputFile::setFrameBuffer
            ((Rgba *)&out,(long)pvVar7 + (long)(dw->min).x * -8 + -(long)(dw->min).y * uVar1 * 8,1);
  iVar5 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&out);
  iVar6 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&out);
  Imf_3_4::TiledRgbaInputFile::readTiles((int)&out,0,iVar5 + -1,0,iVar6 + -1);
  Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  if (-1 < iVar4) {
    lVar11 = (long)pvVar7 + 6;
    phVar9 = &(pixels1._data)->a;
    uVar14 = 0;
    do {
      if (-1 < (int)lVar10) {
        uVar12 = 0;
        do {
          fVar3 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[uVar12 * 4 + -3]._h * 4);
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar11 + -6 + uVar12 * 8) * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p1.r == p2.r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                          ,0x86,
                          "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                         );
          }
          fVar3 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[uVar12 * 4 + -2]._h * 4);
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar11 + -4 + uVar12 * 8) * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p1.g == p2.g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                          ,0x87,
                          "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                         );
          }
          fVar3 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[uVar12 * 4 + -1]._h * 4);
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar11 + -2 + uVar12 * 8) * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p1.b == p2.b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                          ,0x88,
                          "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                         );
          }
          fVar3 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[uVar12 * 4]._h * 4);
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar11 + uVar12 * 8) * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p1.a == p2.a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                          ,0x89,
                          "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                         );
          }
          uVar12 = uVar12 + 1;
        } while ((uVar1 & 0xffffffff) != uVar12);
      }
      uVar14 = uVar14 + 1;
      lVar11 = lVar11 + uVar1 * 8;
      phVar9 = phVar9 + pixels1._sizeY * 4;
    } while (uVar14 != uVar13);
  }
  remove(__filename);
  operator_delete__(pvVar7);
  if (pixels1._data != (Rgba *)0x0) {
    operator_delete__(pixels1._data);
  }
  return;
}

Assistant:

void
writeReadYa (
    Box2i&     dw,
    int        tileSizeX,
    int        tileSizeY,
    const char fileName[],
    void (*fillPixels) (Array2D<Rgba>& pixels, int w, int h))
{
    int           w = dw.max.x - dw.min.x + 1;
    int           h = dw.max.y - dw.min.y + 1;
    Array2D<Rgba> pixels1 (h, w);
    Array2D<Rgba> pixels2 (h, w);

    fillPixels (pixels1, w, h);

    cout << "writing " << flush;

    {
        TiledRgbaOutputFile out (
            fileName,
            tileSizeX,
            tileSizeY,
            ONE_LEVEL,
            ROUND_DOWN,
            dw,
            dw,
            WRITE_YA);

        out.setFrameBuffer (&pixels1[-dw.min.y][-dw.min.x], 1, w);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
    }

    cout << "reading " << flush;

    {
        TiledRgbaInputFile in (fileName);

        in.setFrameBuffer (&pixels2[-dw.min.y][-dw.min.x], 1, w);
        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
    }

    cout << "comparing" << endl;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            const Rgba& p1 = pixels1[y][x];
            const Rgba& p2 = pixels2[y][x];

            assert (p1.r == p2.r);
            assert (p1.g == p2.g);
            assert (p1.b == p2.b);
            assert (p1.a == p2.a);
        }
    }

    remove (fileName);
}